

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btCollisionWorldImporter.cpp
# Opt level: O2

void __thiscall
btCollisionWorldImporter::btCollisionWorldImporter
          (btCollisionWorldImporter *this,btCollisionWorld *world)

{
  this->_vptr_btCollisionWorldImporter = (_func_int **)&PTR__btCollisionWorldImporter_001ecea8;
  this->m_collisionWorld = world;
  this->m_verboseMode = 0;
  (this->m_allocatedCollisionShapes).m_ownsMemory = true;
  (this->m_allocatedCollisionShapes).m_data = (btCollisionShape **)0x0;
  (this->m_allocatedCollisionShapes).m_size = 0;
  (this->m_allocatedCollisionShapes).m_capacity = 0;
  (this->m_allocatedRigidBodies).m_ownsMemory = true;
  (this->m_allocatedRigidBodies).m_data = (btCollisionObject **)0x0;
  (this->m_allocatedRigidBodies).m_size = 0;
  (this->m_allocatedRigidBodies).m_capacity = 0;
  (this->m_allocatedBvhs).m_ownsMemory = true;
  (this->m_allocatedBvhs).m_data = (btOptimizedBvh **)0x0;
  (this->m_allocatedBvhs).m_size = 0;
  (this->m_allocatedBvhs).m_capacity = 0;
  (this->m_allocatedTriangleInfoMaps).m_ownsMemory = true;
  (this->m_allocatedTriangleInfoMaps).m_data = (btTriangleInfoMap **)0x0;
  (this->m_allocatedTriangleInfoMaps).m_size = 0;
  (this->m_allocatedTriangleInfoMaps).m_capacity = 0;
  (this->m_allocatedTriangleIndexArrays).m_ownsMemory = true;
  (this->m_allocatedTriangleIndexArrays).m_data = (btTriangleIndexVertexArray **)0x0;
  (this->m_allocatedTriangleIndexArrays).m_size = 0;
  (this->m_allocatedTriangleIndexArrays).m_capacity = 0;
  (this->m_allocatedbtStridingMeshInterfaceDatas).m_ownsMemory = true;
  (this->m_allocatedbtStridingMeshInterfaceDatas).m_data = (btStridingMeshInterfaceData **)0x0;
  (this->m_allocatedbtStridingMeshInterfaceDatas).m_size = 0;
  (this->m_allocatedbtStridingMeshInterfaceDatas).m_capacity = 0;
  (this->m_allocatedCollisionObjects).m_ownsMemory = true;
  (this->m_allocatedCollisionObjects).m_data = (btCollisionObject **)0x0;
  (this->m_allocatedCollisionObjects).m_size = 0;
  (this->m_allocatedCollisionObjects).m_capacity = 0;
  (this->m_allocatedNames).m_ownsMemory = true;
  (this->m_allocatedNames).m_data = (char **)0x0;
  (this->m_allocatedNames).m_size = 0;
  (this->m_allocatedNames).m_capacity = 0;
  (this->m_indexArrays).m_ownsMemory = true;
  (this->m_indexArrays).m_data = (int **)0x0;
  (this->m_indexArrays).m_size = 0;
  (this->m_indexArrays).m_capacity = 0;
  (this->m_shortIndexArrays).m_ownsMemory = true;
  (this->m_shortIndexArrays).m_data = (short **)0x0;
  (this->m_shortIndexArrays).m_size = 0;
  (this->m_shortIndexArrays).m_capacity = 0;
  (this->m_charIndexArrays).m_ownsMemory = true;
  (this->m_charIndexArrays).m_data = (uchar **)0x0;
  (this->m_charIndexArrays).m_size = 0;
  (this->m_charIndexArrays).m_capacity = 0;
  (this->m_floatVertexArrays).m_ownsMemory = true;
  (this->m_floatVertexArrays).m_data = (btVector3FloatData **)0x0;
  (this->m_floatVertexArrays).m_size = 0;
  (this->m_floatVertexArrays).m_capacity = 0;
  (this->m_doubleVertexArrays).m_ownsMemory = true;
  (this->m_doubleVertexArrays).m_data = (btVector3DoubleData **)0x0;
  (this->m_doubleVertexArrays).m_size = 0;
  (this->m_doubleVertexArrays).m_capacity = 0;
  btHashMap<btHashPtr,_btOptimizedBvh_*>::btHashMap(&this->m_bvhMap);
  btHashMap<btHashPtr,_btTriangleInfoMap_*>::btHashMap(&this->m_timMap);
  btHashMap<btHashString,_btCollisionShape_*>::btHashMap(&this->m_nameShapeMap);
  btHashMap<btHashString,_btCollisionObject_*>::btHashMap(&this->m_nameColObjMap);
  btHashMap<btHashPtr,_const_char_*>::btHashMap(&this->m_objectNameMap);
  btHashMap<btHashPtr,_btCollisionShape_*>::btHashMap(&this->m_shapeMap);
  btHashMap<btHashPtr,_btCollisionObject_*>::btHashMap(&this->m_bodyMap);
  return;
}

Assistant:

btCollisionWorldImporter::btCollisionWorldImporter(btCollisionWorld* world)
:m_collisionWorld(world),
m_verboseMode(0)
{

}